

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O3

bool __thiscall DOMTest::testElementTraversal(DOMTest *this)

{
  XMLCh XVar1;
  XMLCh XVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  short *psVar7;
  XMLCh *pXVar8;
  long *plVar9;
  uint uVar10;
  bool bVar11;
  XMLCh *pXVar12;
  MemBufInputSource is;
  MemBufInputSource aMStack_78 [72];
  
  xercesc_4_0::MemBufInputSource::MemBufInputSource
            (aMStack_78,
             (uchar *)
             "<?xml version=\'1.0\'?><!DOCTYPE g [<!ENTITY ent1 \'<nestedEl>&ent2;</nestedEl>\'><!ENTITY ent2 \'text\'>]><g id=\'shapeGroup\'>\n\n\t<rect id=\'rect1\' x=\'5\' y=\'5\' width=\'310\' height=\'220\' rx=\'15\' ry=\'15\' fill=\'skyblue\'/>\n\t<rect id=\'rect2\' x=\'15\' y=\'15\' width=\'210\' height=\'180\' rx=\'15\' ry=\'15\' fill=\'cornflowerblue\'/>\n\n\t<ellipse id=\'ellipse1\' cx=\'90\' cy=\'70\' rx=\'50\' ry=\'30\' fill=\'yellow\' stroke=\'orange\'/>\n\n\t<path id=\'path1\' stroke-width=\'15\' stroke=\'orange\' fill=\'none\' stroke-linecap=\'round\'\n\t\td=\'M25,150 C180,180 290,0 400,140 S420,100 460,90\'/>\n\t<text id=\'text1\' x=\'0\' y=\'0\' font-size=\'35\' fill=\'yellow\' stroke=\'orange\'\n\t\tstroke-width=\'2\' stroke-linejoin=\'round\' font-weight=\'bold\'>\n\t\t<textPath id=\'textPath1\' href=\'#path1\'>&ent1;&ent2;&ent1;</textPath></text>\n</g>"
             ,0x2f7,"bufId",false,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar4 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(L"LS");
  plVar5 = (long *)(**(code **)(*plVar4 + 0x10))
                             (plVar4,1,0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x20))
                             (plVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("<?xml version=\'1.0\'?><!DOCTYPE g [<!ENTITY ent1 \'<nestedEl>&ent2;</nestedEl>\'><!ENTITY ent2 \'text\'>]><g id=\'shapeGroup\'>\n\n\t<rect id=\'rect1\' x=\'5\' y=\'5\' width=\'310\' height=\'220\' rx=\'15\' ry=\'15\' fill=\'skyblue\'/>\n\t<rect id=\'rect2\' x=\'15\' y=\'15\' width=\'210\' height=\'180\' rx=\'15\' ry=\'15\' fill=\'cornflowerblue\'/>\n\n\t<ellipse id=\'ellipse1\' cx=\'90\' cy=\'70\' rx=\'50\' ry=\'30\' fill=\'yellow\' stroke=\'orange\'/>\n\n\t<path id=\'path1\' stroke-width=\'15\' stroke=\'orange\' fill=\'none\' stroke-linecap=\'round\'\n\t\td=\'M25,150 C180,180 290,0 400,140 S420,100 460,90\'/>\n\t<text id=\'text1\' x=\'0\' y=\'0\' font-size=\'35\' fill=\'yellow\' stroke=\'orange\'\n\t\tstroke-width=\'2\' stroke-linejoin=\'round\' font-weight=\'bold\'>\n\t\t<textPath id=\'textPath1\' href=\'#path1\'>&ent1;&ent2;&ent1;</textPath></text>\n</g>"
             ,tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar4 + 0x40))(plVar4,tempStr);
  plVar4 = (long *)(**(code **)(*plVar5 + 0x38))(plVar5,plVar4);
  plVar5 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x30))(plVar5);
  lVar6 = (**(code **)(*plVar5 + 0x18))(plVar5);
  if (lVar6 == 0xb) {
    plVar5 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
    plVar5 = (long *)(**(code **)(*plVar5 + 0x38))(plVar5);
    uVar10 = 0x144d;
    if (((plVar5 != (long *)0x0) && (iVar3 = (**(code **)(*plVar5 + 0x20))(plVar5), iVar3 == 3)) &&
       (psVar7 = (short *)(**(code **)(*plVar5 + 0x18))(plVar5), *psVar7 != 0xd)) {
      plVar5 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
      plVar5 = (long *)(**(code **)(*plVar5 + 0x1e0))(plVar5);
      xercesc_4_0::XMLString::transcode
                ("id",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pXVar12 = tempStr2;
      xercesc_4_0::XMLString::transcode
                ("rect1",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      uVar10 = 0x1455;
      if ((plVar5 != (long *)0x0) && (iVar3 = (**(code **)(*plVar5 + 0x20))(plVar5), iVar3 == 1)) {
        pXVar8 = (XMLCh *)(**(code **)(*plVar5 + 0x148))(plVar5,tempStr);
        if (pXVar8 == tempStr2) {
LAB_0011b833:
          lVar6 = 5;
          do {
            plVar5 = (long *)(**(code **)(*plVar5 + 0x1f8))(plVar5);
            lVar6 = lVar6 + -1;
          } while (plVar5 != (long *)0x0);
          if (lVar6 == 0) {
            plVar5 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
            lVar6 = (**(code **)(*plVar5 + 0x200))(plVar5);
            if (lVar6 == 5) {
              plVar4 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
              plVar4 = (long *)(**(code **)(*plVar4 + 0x1e8))(plVar4);
              xercesc_4_0::XMLString::transcode
                        ("id",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
              pXVar12 = tempStr2;
              xercesc_4_0::XMLString::transcode
                        ("text1",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
              uVar10 = 0x146e;
              if ((plVar4 != (long *)0x0) &&
                 (iVar3 = (**(code **)(*plVar4 + 0x20))(plVar4), iVar3 == 1)) {
                pXVar8 = (XMLCh *)(**(code **)(*plVar4 + 0x148))(plVar4,tempStr);
                if (pXVar8 == tempStr2) {
LAB_0011b937:
                  plVar4 = (long *)(**(code **)(*plVar4 + 0x1e0))(plVar4);
                  xercesc_4_0::XMLString::transcode
                            ("id",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
                  pXVar12 = tempStr2;
                  xercesc_4_0::XMLString::transcode
                            ("textPath1",tempStr2,3999,
                             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
                  uVar10 = 0x1476;
                  if ((plVar4 != (long *)0x0) &&
                     (iVar3 = (**(code **)(*plVar4 + 0x20))(plVar4), iVar3 == 1)) {
                    pXVar8 = (XMLCh *)(**(code **)(*plVar4 + 0x148))(plVar4,tempStr);
                    if (pXVar8 == tempStr2) {
LAB_0011b9ee:
                      lVar6 = (**(code **)(*plVar4 + 0x200))(plVar4);
                      if (lVar6 == 2) {
                        plVar5 = (long *)(**(code **)(*plVar4 + 0x1e0))(plVar4);
                        uVar10 = 0x1482;
                        if ((plVar5 != (long *)0x0) &&
                           (iVar3 = (**(code **)(*plVar5 + 0x20))(plVar5), iVar3 == 1)) {
                          plVar4 = (long *)(**(code **)(*plVar4 + 0x1e8))(plVar4);
                          uVar10 = 0x1488;
                          if ((plVar4 != (long *)0x0) &&
                             (iVar3 = (**(code **)(*plVar4 + 0x20))(plVar4), iVar3 == 1)) {
                            plVar9 = (long *)(**(code **)(*plVar5 + 0x1f8))(plVar5);
                            uVar10 = 0x148d;
                            if (plVar9 == plVar4) {
                              plVar4 = (long *)(**(code **)(*plVar4 + 0x1f0))(plVar4);
                              bVar11 = true;
                              if (plVar5 == plVar4) goto LAB_0011baa1;
                            }
                          }
                        }
                      }
                      else {
                        uVar10 = 0x147c;
                      }
                    }
                    else if (pXVar8 == (XMLCh *)0x0) {
LAB_0011b9e3:
                      if (*pXVar12 == L'\0') goto LAB_0011b9ee;
                    }
                    else {
                      pXVar12 = tempStr2;
                      do {
                        XVar1 = *pXVar8;
                        if (XVar1 == L'\0') goto LAB_0011b9e3;
                        pXVar8 = pXVar8 + 1;
                        XVar2 = *pXVar12;
                        pXVar12 = pXVar12 + 1;
                      } while (XVar1 == XVar2);
                    }
                  }
                }
                else if (pXVar8 == (XMLCh *)0x0) {
LAB_0011b92c:
                  if (*pXVar12 == L'\0') goto LAB_0011b937;
                }
                else {
                  pXVar12 = tempStr2;
                  do {
                    XVar1 = *pXVar8;
                    if (XVar1 == L'\0') goto LAB_0011b92c;
                    pXVar8 = pXVar8 + 1;
                    XVar2 = *pXVar12;
                    pXVar12 = pXVar12 + 1;
                  } while (XVar1 == XVar2);
                }
              }
            }
            else {
              uVar10 = 0x1466;
            }
          }
          else {
            uVar10 = 0x1460;
          }
        }
        else if (pXVar8 == (XMLCh *)0x0) {
LAB_0011b827:
          if (*pXVar12 == L'\0') goto LAB_0011b833;
        }
        else {
          pXVar12 = tempStr2;
          do {
            XVar1 = *pXVar8;
            if (XVar1 == L'\0') goto LAB_0011b827;
            pXVar8 = pXVar8 + 1;
            XVar2 = *pXVar12;
            pXVar12 = pXVar12 + 1;
          } while (XVar1 == XVar2);
        }
      }
    }
  }
  else {
    uVar10 = 0x1447;
  }
  testElementTraversal((DOMTest *)(ulong)uVar10);
  bVar11 = false;
LAB_0011baa1:
  xercesc_4_0::MemBufInputSource::~MemBufInputSource(aMStack_78);
  return bVar11;
}

Assistant:

bool DOMTest::testElementTraversal() {
	const char* sXml="<?xml version='1.0'?>"
				"<!DOCTYPE g ["
                "<!ENTITY ent1 '<nestedEl>&ent2;</nestedEl>'>"
                "<!ENTITY ent2 'text'>"
                "]>"
				"<g id='shapeGroup'>\n"
                "\n"
                "\t<rect id='rect1' x='5' y='5' width='310' height='220' rx='15' ry='15' fill='skyblue'/>\n"
                "\t<rect id='rect2' x='15' y='15' width='210' height='180' rx='15' ry='15' fill='cornflowerblue'/>\n"
                "\n"
                "\t<ellipse id='ellipse1' cx='90' cy='70' rx='50' ry='30' fill='yellow' stroke='orange'/>\n"
                "\n"
                "\t<path id='path1' stroke-width='15' stroke='orange' fill='none' stroke-linecap='round'\n"
                "\t\td='M25,150 C180,180 290,0 400,140 S420,100 460,90'/>\n"
                "\t<text id='text1' x='0' y='0' font-size='35' fill='yellow' stroke='orange'\n"
                "\t\tstroke-width='2' stroke-linejoin='round' font-weight='bold'>\n"
                "\t\t<textPath id='textPath1' href='#path1'>&ent1;&ent2;&ent1;</textPath></text>\n"
                "</g>";
	MemBufInputSource is((XMLByte*)sXml, strlen(sXml), "bufId");

    static const XMLCh gLS[] = { chLatin_L, chLatin_S, chNull };
    DOMImplementationLS *impl = (DOMImplementationLS*)DOMImplementationRegistry::getDOMImplementation(gLS);
    DOMLSParser       *domBuilder = impl->createLSParser(DOMImplementationLS::MODE_SYNCHRONOUS, 0);
    DOMLSInput        *input = impl->createLSInput();
    XMLString::transcode(sXml, tempStr, 3999);
    input->setStringData(tempStr);
    try
    {
        DOMDocument* doc=domBuilder->parse(input);

        XMLSize_t c = doc->getDocumentElement()->getChildNodes()->getLength();
	    if(c!=11)
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        DOMNode* firstNode = doc->getDocumentElement()->getFirstChild();
        if(firstNode==NULL || firstNode->getNodeType()!=DOMNode::TEXT_NODE || *firstNode->getNodeValue()=='\r')
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        DOMElement* childNode = doc->getDocumentElement()->getFirstElementChild();
        XMLString::transcode("id", tempStr, 3999);
        XMLString::transcode("rect1", tempStr2, 3999);
        if(childNode==NULL || childNode->getNodeType()!=DOMNode::ELEMENT_NODE || !XMLString::equals(childNode->getAttribute(tempStr),tempStr2))
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        XMLSize_t count=0;
        while(childNode!=NULL)
        {
            count++;
            childNode=childNode->getNextElementSibling();
        }
        if(count!=5)
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        count = doc->getDocumentElement()->getChildElementCount();
        if(count!=5)
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        DOMElement* text=doc->getDocumentElement()->getLastElementChild();
        XMLString::transcode("id", tempStr, 3999);
        XMLString::transcode("text1", tempStr2, 3999);
        if(text==NULL || text->getNodeType()!=DOMNode::ELEMENT_NODE || !XMLString::equals(text->getAttribute(tempStr),tempStr2))
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        DOMElement* textPath=text->getFirstElementChild();
        XMLString::transcode("id", tempStr, 3999);
        XMLString::transcode("textPath1", tempStr2, 3999);
        if(textPath==NULL || textPath->getNodeType()!=DOMNode::ELEMENT_NODE || !XMLString::equals(textPath->getAttribute(tempStr),tempStr2))
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        count = textPath->getChildElementCount();
        if(count!=2)
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        DOMElement* insideEntity=textPath->getFirstElementChild();
        if(insideEntity==NULL || insideEntity->getNodeType()!=DOMNode::ELEMENT_NODE)
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        DOMElement* insideEntity2=textPath->getLastElementChild();
        if(insideEntity2==NULL || insideEntity2->getNodeType()!=DOMNode::ELEMENT_NODE)
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        if(insideEntity->getNextElementSibling()!=insideEntity2 || insideEntity!=insideEntity2->getPreviousElementSibling())
	    {
            fprintf(stderr, "checking ElementTraversal failed at line %i\n",  __LINE__);
		    return false;
	    }
        return true;
    }
    catch(DOMLSException&)
    {
        fprintf(stderr, "checking testElementTraversal failed at line %i\n",  __LINE__);
        return false;
    }

    input->release();
    domBuilder->release();

    return true;
}